

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O2

void zhash_map_values(zhash_t *zh,_func_void_varargs *f)

{
  int iVar1;
  void *value;
  void *key;
  zhash_iterator_t itr;
  undefined8 local_48;
  undefined1 local_40 [8];
  zhash_iterator_t local_38;
  
  if (zh != (zhash_t *)0x0) {
    if (f != (_func_void_varargs *)0x0) {
      local_38.last_entry = -1;
      local_38.zh = zh;
      local_38.czh = zh;
      while( true ) {
        iVar1 = zhash_iterator_next_volatile(&local_38,local_40,&local_48);
        if (iVar1 == 0) break;
        (*f)(local_48);
      }
    }
    return;
  }
  __assert_fail("zh != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                ,0x185,"void zhash_map_values(zhash_t *, void (*)())");
}

Assistant:

void zhash_map_values(zhash_t * zh, void (*f)())
{
    assert(zh != NULL);
    if (f == NULL)
        return;

    zhash_iterator_t itr;
    zhash_iterator_init(zh, &itr);

    void *key, *value;
    while(zhash_iterator_next_volatile(&itr, &key, &value)) {
        f(value);
    }
}